

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

int __thiscall bwtil::cw_bwt::init(cw_bwt *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulint uVar4;
  ostream *this_00;
  void *this_01;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  double avg_height;
  ulint i;
  ulint sum_of_lenghts;
  ulint sum_of_heights;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_00000088;
  cw_bwt *in_stack_000000c0;
  cw_bwt *in_stack_00000380;
  ulong local_20;
  long local_18;
  long local_10;
  
  uVar4 = ContextAutomata::numberOfStates(&this->ca);
  this->number_of_contexts = uVar4;
  uVar3 = ContextAutomata::alphabetSize(&this->ca);
  this->sigma = uVar3;
  this->TERMINATOR = '\0';
  initStructures(in_stack_00000380);
  build(in_stack_000000c0);
  local_10 = 0;
  local_18 = 0;
  for (local_20 = 0; local_20 < this->number_of_contexts; local_20 = local_20 + 1) {
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::operator[](&this->dynStrings,local_20);
    uVar4 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::numberOfBits
                      ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
                       sum_of_heights);
    local_18 = uVar4 + local_18;
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::operator[](&this->dynStrings,local_20);
    uVar4 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::sumOfHeights
                      (in_stack_00000088);
    local_10 = uVar4 + local_10;
  }
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,local_10);
  auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,local_18);
  if ((this->verbose & 1U) != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"\nAverage packed B-tree height is: ");
    this_01 = (void *)std::ostream::operator<<(this_00,auVar1._0_8_ / auVar2._0_8_);
    this = (cw_bwt *)std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return (int)this;
}

Assistant:

void init(){

		number_of_contexts = ca.numberOfStates();

		sigma = ca.alphabetSize();//this takes into account also the terminator character
		TERMINATOR = 0;

		initStructures();

		build();

		ulint sum_of_heights=0;
		ulint sum_of_lenghts=0;

		for(ulint i=0;i<number_of_contexts;i++){

			sum_of_lenghts += dynStrings[i].numberOfBits();
			sum_of_heights += dynStrings[i].sumOfHeights();

		}

		double avg_height = (double)sum_of_heights/(double)sum_of_lenghts;

		if(verbose) cout << "\nAverage packed B-tree height is: " << avg_height << endl;

	}